

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

void process_reserved_name(char *s,char *prefix,uint32_t *max_num)

{
  int iVar1;
  size_t __n;
  ulong uVar2;
  size_t len;
  char *pcStack_28;
  uint32_t num;
  char *end;
  uint32_t *max_num_local;
  char *prefix_local;
  char *s_local;
  
  end = (char *)max_num;
  max_num_local = (uint32_t *)prefix;
  prefix_local = s;
  __n = strlen(prefix);
  iVar1 = strncmp(prefix_local,(char *)max_num_local,__n);
  if (iVar1 == 0) {
    uVar2 = strtoul(prefix_local + __n,&stack0xffffffffffffffd8,10);
    if ((*pcStack_28 == '\0') && (*(uint *)end < (uint)uVar2)) {
      *(uint *)end = (uint)uVar2;
    }
  }
  return;
}

Assistant:

static void process_reserved_name (const char *s, const char *prefix, uint32_t *max_num) {
  char *end;
  uint32_t num;
  size_t len = strlen (prefix);

  if (strncmp (s, prefix, len) != 0) return;
  num = strtoul (s + len, &end, 10);
  if (*end != '\0') return;
  if (*max_num < num) *max_num = num;
}